

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::DisplayGraph(cmComputeTargetDepends *this,Graph *graph,string *name)

{
  FILE *pFVar1;
  bool bVar2;
  uint uVar3;
  undefined8 uVar4;
  size_type sVar5;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_00;
  reference ppcVar6;
  reference this_01;
  pointer this_02;
  char *pcVar7;
  cmTarget *dependee;
  const_iterator cStack_48;
  int dependee_index;
  __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
  local_40;
  const_iterator ni;
  cmTarget *depender;
  EdgeList *nl;
  int depender_index;
  int n;
  string *name_local;
  Graph *graph_local;
  cmComputeTargetDepends *this_local;
  
  pFVar1 = _stderr;
  uVar4 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"The %s target dependency graph is:\n",uVar4);
  sVar5 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size
                    (&graph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  for (nl._0_4_ = 0; (int)(uint)nl < (int)sVar5; nl._0_4_ = (uint)nl + 1) {
    this_00 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                         (&graph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                          (long)(int)(uint)nl)->
               super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
    ppcVar6 = std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::operator[]
                        (&this->Targets,(long)(int)(uint)nl);
    pFVar1 = _stderr;
    ni._M_current = (cmGraphEdge *)*ppcVar6;
    cmTarget::GetName_abi_cxx11_((cmTarget *)ni._M_current);
    uVar4 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"target %d is [%s]\n",(ulong)(uint)nl,uVar4);
    local_40._M_current =
         (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin(this_00);
    while( true ) {
      cStack_48 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(this_00);
      bVar2 = __gnu_cxx::operator!=(&local_40,&stack0xffffffffffffffb8);
      if (!bVar2) break;
      this_01 = __gnu_cxx::
                __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                ::operator*(&local_40);
      uVar3 = cmGraphEdge::operator_cast_to_int(this_01);
      ppcVar6 = std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::operator[]
                          (&this->Targets,(long)(int)uVar3);
      pFVar1 = _stderr;
      cmTarget::GetName_abi_cxx11_(*ppcVar6);
      uVar4 = std::__cxx11::string::c_str();
      this_02 = __gnu_cxx::
                __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                ::operator->(&local_40);
      bVar2 = cmGraphEdge::IsStrong(this_02);
      pcVar7 = "weak";
      if (bVar2) {
        pcVar7 = "strong";
      }
      fprintf(pFVar1,"  depends on target %d [%s] (%s)\n",(ulong)uVar3,uVar4,pcVar7);
      __gnu_cxx::
      __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
      ::operator++(&local_40);
    }
  }
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void
cmComputeTargetDepends::DisplayGraph(Graph const& graph,
                                     const std::string& name)
{
  fprintf(stderr, "The %s target dependency graph is:\n", name.c_str());
  int n = static_cast<int>(graph.size());
  for(int depender_index = 0; depender_index < n; ++depender_index)
    {
    EdgeList const& nl = graph[depender_index];
    cmTarget const* depender = this->Targets[depender_index];
    fprintf(stderr, "target %d is [%s]\n",
            depender_index, depender->GetName().c_str());
    for(EdgeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni)
      {
      int dependee_index = *ni;
      cmTarget const* dependee = this->Targets[dependee_index];
      fprintf(stderr, "  depends on target %d [%s] (%s)\n", dependee_index,
              dependee->GetName().c_str(), ni->IsStrong()? "strong" : "weak");
      }
    }
  fprintf(stderr, "\n");
}